

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Empty.hpp
# Opt level: O0

IsEmpty * __thiscall
ut11::Operands::IsEmpty::GetErrorMessage<std::__cxx11::string>
          (IsEmpty *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  utility local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream errorMessage;
  ostream local_198 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_local;
  IsEmpty *this_local;
  
  local_20 = in_RDX;
  actual_local = actual;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Expected empty but was ");
  utility::ToString<std::__cxx11::string>(local_1d8,local_20);
  std::operator<<(poVar1,(string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

inline std::string GetErrorMessage(const U& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected empty but was " << utility::ToString(actual);
				return errorMessage.str();
			}